

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

SmallBuffer *
helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,
                   vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  value_t vVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *val_00;
  json_value jVar2;
  pointer pcVar3;
  undefined8 __n;
  _Alloc_hider _Var4;
  string *val_01;
  reference pvVar5;
  char *pcVar6;
  undefined8 uVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  complex<double> *element;
  pointer pcVar8;
  double dVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  vector<double,_std::allocator<double>_> vectorVal;
  json json;
  json jsonArray;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  double local_b8;
  string local_a8;
  string local_88;
  double local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  json_value jStack_50;
  data local_48;
  json_value local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  
  val_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  jVar2 = (json_value)
          (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
          _M_impl.super__Vector_impl_data._M_finish;
  if (val_00 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)jVar2.object) {
    emptyBlock(__return_storage_ptr__,type,HELICS_COMPLEX_VECTOR);
    return __return_storage_ptr__;
  }
  if ((long)jVar2.object - (long)val_00 == 0x10) {
    typeConvert(__return_storage_ptr__,type,(complex<double> *)val_00);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    local_c8._M_allocated_capacity =
         (long)
         "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
         + 0x5f;
    local_c8._8_8_ = 1;
    local_88._M_string_length =
         (size_type)
         ::fmt::v11::detail::value<fmt::v11::context>::
         format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,char,void>>
    ;
    fmt.size_ = 0xf;
    fmt.data_ = (char *)0x4;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    local_d8._M_allocated_capacity = (size_type)val_00;
    local_d8._8_8_ = jVar2;
    local_88._M_dataplus._M_p = (pointer)&local_d8;
    ::fmt::v11::vformat_abi_cxx11_(&local_a8,(v11 *)0x3d2335,fmt,args);
    local_38 = (json_value)local_a8._M_string_length;
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8._M_dataplus._M_p;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_38)
    ;
    local_88.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    uVar7 = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0022c9d6;
  case HELICS_DOUBLE:
    local_d8._M_allocated_capacity = (size_type)vectorNorm(val);
    ValueConverter<double>::convert
              (__return_storage_ptr__,(double *)&local_d8._M_allocated_capacity);
    break;
  case HELICS_INT:
    dVar9 = vectorNorm(val);
    local_d8._M_allocated_capacity = (long)dVar9;
    goto LAB_0022ca5a;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,(complex<double> *)val_00)
    ;
    break;
  case HELICS_VECTOR:
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_c8._M_allocated_capacity = 0;
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)&local_d8,
               (long)jVar2.object - (long)val_00 >> 3);
    pcVar8 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar8 != pcVar3) {
      do {
        local_a8._M_dataplus._M_p = *(pointer *)pcVar8->_M_value;
        if (local_d8._8_8_ == local_c8._M_allocated_capacity) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_d8,(iterator)local_d8._8_8_,
                     (double *)&local_a8);
        }
        else {
          *(pointer *)local_d8._8_8_ = local_a8._M_dataplus._M_p;
          local_d8._8_8_ = local_d8._8_8_ + 8;
        }
        local_a8._M_dataplus._M_p = *(pointer *)(pcVar8->_M_value + 8);
        if (local_d8._8_8_ == local_c8._M_allocated_capacity) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_d8,(iterator)local_d8._8_8_,
                     (double *)&local_a8);
        }
        else {
          *(pointer *)local_d8._8_8_ = local_a8._M_dataplus._M_p;
          local_d8._8_8_ = local_d8._8_8_ + 8;
        }
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 != pcVar3);
    }
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return __return_storage_ptr__;
    }
    pcVar6 = (char *)(local_c8._M_allocated_capacity - local_d8._0_8_);
    uVar7 = local_d8._M_allocated_capacity;
    goto LAB_0022c9d9;
  case HELICS_NAMED_POINT:
    local_38.object = (object_t *)&local_a8;
    local_a8.field_2._M_allocated_capacity =
         (long)
         "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
         + 0x5f;
    local_a8.field_2._8_8_ = 1;
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)::fmt::v11::detail::value<fmt::v11::context>::
                  format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,char,void>>
    ;
    fmt_00.size_ = 0xf;
    fmt_00.data_ = (char *)0x4;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_38;
    local_a8._M_dataplus._M_p = (pointer)val_00;
    local_a8._M_string_length = (size_type)jVar2;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)0x3d2335,fmt_00,args_00);
    _Var4._M_p = local_88._M_dataplus._M_p;
    pcVar6 = local_88._M_dataplus._M_p + (long)(_Rep_type *)local_88._M_string_length;
    local_60 = nan("0");
    local_d8._M_allocated_capacity = (size_type)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,_Var4._M_p,pcVar6);
    local_b8 = local_60;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_allocated_capacity != &local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,
                      (ulong)(local_c8._M_allocated_capacity + 1));
    }
    uVar7 = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
LAB_0022c9d6:
    pcVar6 = (char *)(local_88.field_2._M_allocated_capacity + 1);
LAB_0022c9d9:
    operator_delete((void *)uVar7,(ulong)pcVar6);
    break;
  case HELICS_BOOL:
    dVar9 = vectorNorm(val);
    pcVar6 = "+0";
    if (dVar9 != 0.0) {
      pcVar6 = "*1";
    }
    if (NAN(dVar9)) {
      pcVar6 = "*1";
    }
    local_d8._8_8_ = pcVar6 + 1;
    local_d8._M_allocated_capacity = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_d8)
    ;
    break;
  case HELICS_TIME:
    dVar9 = vectorNorm(val);
    if (dVar9 <= -9223372036.854765) {
      local_d8._M_allocated_capacity = 0x8000000000000001;
    }
    else {
      local_d8._M_allocated_capacity = 0x7fffffffffffffff;
      if (dVar9 < 9223372036.854765) {
        local_d8._M_allocated_capacity =
             (size_type)
             (dVar9 * 1000000000.0 +
             *(double *)(&DAT_003d20a0 + (ulong)(0.0 <= dVar9 * 1000000000.0) * 8));
      }
    }
LAB_0022ca5a:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)local_d8._M_local_buf);
    break;
  default:
    if (type == HELICS_JSON) {
      local_a8._M_dataplus._M_p = local_a8._M_dataplus._M_p & 0xffffffffffffff00;
      local_a8._M_string_length = 0;
      val_01 = typeNameStringRef_abi_cxx11_(HELICS_COMPLEX_VECTOR);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,val_01);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_a8,"type");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_48.m_type;
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_48.m_value;
      local_48.m_type = vVar1;
      local_48.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_88,(initializer_list_t)ZEXT816(0),false,array);
      pcVar8 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pcVar8 != pcVar3) {
        do {
          local_d8._M_allocated_capacity = 0;
          local_d8._8_8_ = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_d8,*(number_float_t *)pcVar8->_M_value);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_88,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_d8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_d8);
          local_d8._M_allocated_capacity = 0;
          local_d8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_d8,*(number_float_t *)(pcVar8->_M_value + 8));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_88,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_d8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_d8);
          pcVar8 = pcVar8 + 1;
        } while (pcVar8 != pcVar3);
      }
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_dataplus._M_p;
      jStack_50 = (json_value)local_88._M_string_length;
      local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffffffffff00;
      local_88._M_string_length = 0;
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_a8,"value");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = (value_t)local_58;
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71(local_58._1_7_,vVar1);
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = jStack_50;
      jStack_50 = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_58);
      fileops::generateJsonString((string *)&local_d8,(json *)&local_a8,true);
      __n = local_d8._8_8_;
      uVar7 = local_d8._M_allocated_capacity;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_d8._8_8_);
      __return_storage_ptr__->bufferSize = __n;
      memcpy(__return_storage_ptr__->heap,(void *)uVar7,__n);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_allocated_capacity != &local_c8) {
        operator_delete((void *)local_d8._M_allocated_capacity,
                        (ulong)(local_c8._M_allocated_capacity + 1));
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_a8);
      return __return_storage_ptr__;
    }
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,val);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const std::vector<std::complex<double>>& val)
{
    if (val.empty()) {
        return emptyBlock(type, DataType::HELICS_COMPLEX_VECTOR);
    }
    if (val.size() == 1) {
        return typeConvert(type, val[0]);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(val));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(val)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(
                static_cast<int64_t>(vectorNorm(val)));  // NOLINT
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(val[0]);
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(val) != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsComplexVectorString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsComplexVectorString(val), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
        default:
            return ValueConverter<std::vector<std::complex<double>>>::convert(val);
        case DataType::HELICS_VECTOR: {
            std::vector<double> vectorVal;
            vectorVal.reserve(val.size() * 2);
            for (const auto& vali : val) {
                vectorVal.push_back(vali.real());
                vectorVal.push_back(vali.imag());
            }
            return ValueConverter<std::vector<double>>::convert(vectorVal);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_COMPLEX_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (const auto& element : val) {
                jsonArray.push_back(element.real());
                jsonArray.push_back(element.imag());
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}